

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void DLevelScript::SetLineTexture(int lineid,int side,int position,int name)

{
  FTextureID FVar1;
  uint uVar2;
  char *name_00;
  FLineIdIterator itr;
  FLineIdIterator local_38;
  
  name_00 = FBehavior::StaticLookupString(name);
  if (name_00 != (char *)0x0) {
    FVar1 = FTextureManager::GetTexture(&TexMan,name_00,1,2);
    local_38.start = tagManager.IDHashFirst[lineid & 0xff];
    local_38.searchtag = lineid;
    uVar2 = FLineIdIterator::Next(&local_38);
    if (-1 < (int)uVar2) {
      do {
        if (lines[uVar2].sidedef[side != 0] != (side_t *)0x0 && (uint)position < 3) {
          lines[uVar2].sidedef[side != 0]->textures[(uint)position].texture.texnum = FVar1.texnum;
        }
        uVar2 = FLineIdIterator::Next(&local_38);
      } while (-1 < (int)uVar2);
    }
  }
  return;
}

Assistant:

void DLevelScript::SetLineTexture (int lineid, int side, int position, int name)
{
	FTextureID texture;
	int linenum = -1;
	const char *texname = FBehavior::StaticLookupString (name);

	if (texname == NULL)
		return;

	side = !!side;

	texture = TexMan.GetTexture (texname, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable);

	FLineIdIterator itr(lineid);
	while ((linenum = itr.Next()) >= 0)
	{
		side_t *sidedef;

		sidedef = lines[linenum].sidedef[side];
		if (sidedef == NULL)
			continue;

		switch (position)
		{
		case TEXTURE_TOP:
			sidedef->SetTexture(side_t::top, texture);
			break;
		case TEXTURE_MIDDLE:
			sidedef->SetTexture(side_t::mid, texture);
			break;
		case TEXTURE_BOTTOM:
			sidedef->SetTexture(side_t::bottom, texture);
			break;
		default:
			break;
		}

	}
}